

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O0

void __thiscall amount_tests::BinaryOperatorTest::test_method(BinaryOperatorTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CFeeRate b;
  CFeeRate a;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  assertion_result *in_stack_fffffffffffffaf8;
  const_string *in_stack_fffffffffffffb10;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffffb18;
  const_string *in_stack_fffffffffffffb20;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffb28;
  unit_test_log_t *this_00;
  lazy_ostream local_3c8 [2];
  assertion_result local_3a8;
  const_string local_390;
  const_string local_370 [2];
  lazy_ostream local_350 [2];
  assertion_result local_330;
  unit_test_log_t local_308 [2];
  const_string local_2f8 [2];
  lazy_ostream local_2d8 [2];
  assertion_result local_2b8 [2];
  const_string local_280 [2];
  lazy_ostream local_260 [2];
  assertion_result local_240 [2];
  const_string local_208 [2];
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [2];
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  assertion_result local_150 [2];
  const_string local_118 [2];
  lazy_ostream local_f8 [2];
  assertion_result local_d8 [2];
  const_string local_a0 [2];
  lazy_ostream local_80 [2];
  assertion_result local_60 [2];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffffae8);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffffae8);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffae8,0);
  local_10 = local_20;
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffae8,0);
  local_18 = local_28;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    ::operator<((CFeeRate *)in_stack_fffffffffffffaf8,
                (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_60,local_80,local_a0,0x79,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    operator>((CFeeRate *)in_stack_fffffffffffffaf8,
              (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d8,local_f8,local_118,0x7a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    ::operator==((CFeeRate *)in_stack_fffffffffffffaf8,
                 (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_150,local_170,local_190,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    operator<=((CFeeRate *)in_stack_fffffffffffffaf8,
               (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c8,local_1e8,local_208,0x7c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    operator<=((CFeeRate *)in_stack_fffffffffffffaf8,
               (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_240,local_260,local_280,0x7d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18
               ,in_stack_fffffffffffffb10);
    operator>=((CFeeRate *)in_stack_fffffffffffffaf8,
               (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b8,local_2d8,local_2f8,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = local_308;
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
    operator>=((CFeeRate *)in_stack_fffffffffffffaf8,
               (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_330,local_350,local_370,0x7f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CFeeRate::operator+=
            ((CFeeRate *)in_stack_fffffffffffffaf8,
             (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    msg = &local_390;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffb18,msg);
    ::operator==((CFeeRate *)in_stack_fffffffffffffaf8,
                 (CFeeRate *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7);
    in_stack_fffffffffffffb18 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffae8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8,
               (pointer)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (unsigned_long)in_stack_fffffffffffffae8);
    in_stack_fffffffffffffae8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3a8,local_3c8,(const_string *)&stack0xfffffffffffffc18,0x82,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffae8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffae8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(BinaryOperatorTest)
{
    CFeeRate a, b;
    a = CFeeRate(1);
    b = CFeeRate(2);
    BOOST_CHECK(a < b);
    BOOST_CHECK(b > a);
    BOOST_CHECK(a == a);
    BOOST_CHECK(a <= b);
    BOOST_CHECK(a <= a);
    BOOST_CHECK(b >= a);
    BOOST_CHECK(b >= b);
    // a should be 0.00000002 BTC/kvB now
    a += a;
    BOOST_CHECK(a == b);
}